

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetRudderPololu(POLOLU *pPololu,double angle)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = pPololu->MidAngle;
  if (0.0 <= angle) {
    dVar4 = pPololu->MinAngle;
    dVar6 = pPololu->MaxAngle;
    dVar7 = dVar6 - dVar1;
  }
  else {
    dVar4 = pPololu->MinAngle;
    dVar6 = pPololu->MaxAngle;
    dVar7 = dVar1 - dVar4;
  }
  dVar6 = ABS(dVar6);
  dVar8 = ABS(dVar4);
  if (ABS(dVar4) <= dVar6) {
    dVar8 = dVar6;
  }
  dVar5 = ABS(dVar4);
  if (ABS(dVar4) <= dVar6) {
    dVar5 = dVar6;
  }
  iVar2 = (int)(((dVar1 + (dVar7 * angle) / dVar8) * 500.0) / dVar5);
  iVar3 = 500;
  if (iVar2 < 500) {
    iVar3 = iVar2;
  }
  iVar2 = -500;
  if (-500 < iVar3) {
    iVar2 = iVar3;
  }
  iVar3 = SetPWMPololu(pPololu,pPololu->rudderchan,iVar2 + 0x5dc);
  return iVar3;
}

Assistant:

inline int SetRudderPololu(POLOLU* pPololu, double angle)
{
	int pw = 0;
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pw = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pw = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pw = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // !DISABLE_POLOLU_MIDANGLE

	pw = max(min(pw, DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	return SetPWMPololu(pPololu, pPololu->rudderchan, pw);
}